

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::write_pointer<unsigned_long>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
           *this,unsigned_long value,format_specs *specs)

{
  char *pcVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  unsigned_long uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  pointer_writer<unsigned_long> pw;
  format_specs specs_copy;
  pointer_writer<unsigned_long> local_38;
  format_specs local_28;
  
  uVar4 = value;
  lVar7 = 2;
  do {
    lVar6 = lVar7;
    lVar7 = lVar6 + 1;
    bVar9 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar9);
  local_38.num_digits = (int)lVar6 + -1;
  local_38.value = value;
  if (specs == (format_specs *)0x0) {
    pbVar2 = (this->out_).container;
    sVar3 = pbVar2->size_;
    uVar8 = lVar7 + sVar3;
    if (pbVar2->capacity_ < uVar8) {
      (**pbVar2->_vptr_buffer)(pbVar2,uVar8);
    }
    pbVar2->size_ = uVar8;
    pcVar5 = pbVar2->ptr_;
    pcVar1 = pcVar5 + sVar3;
    pcVar1[0] = '0';
    pcVar1[1] = 'x';
    pcVar5 = pcVar5 + (long)local_38.num_digits + sVar3 + 1;
    do {
      *pcVar5 = "0123456789abcdef"[(uint)local_38.value & 0xf];
      pcVar5 = pcVar5 + -1;
      bVar9 = 0xf < local_38.value;
      local_38.value = local_38.value >> 4;
    } while (bVar9);
  }
  else {
    local_28.width = specs->width;
    local_28.precision = specs->precision;
    local_28.type = specs->type;
    local_28._9_1_ = specs->field_0x9;
    local_28.fill.data_ = specs->fill;
    if ((local_28._8_8_ & 0xf00) == 0) {
      local_28._8_8_ = local_28._8_8_ | 0x200;
    }
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
    ::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::pointer_writer<unsigned_long>&>
              ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                *)this,&local_28,&local_38);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }